

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_internal_defs.hpp
# Opt level: O2

string * iutest::detail::GetTypeName<iutest::TemplateValue<0l>>(void)

{
  char *__ptr;
  string *in_RDI;
  char *__s;
  int status;
  allocator<char> local_25;
  int local_24;
  
  local_24 = 1;
  __ptr = (char *)__cxa_demangle("N6iutest13TemplateValueILl0EEE",0,0,&local_24);
  __s = "N6iutest13TemplateValueILl0EEE";
  if (local_24 == 0) {
    __s = __ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_25);
  free(__ptr);
  return in_RDI;
}

Assistant:

inline ::std::string GetTypeName()
{
#if IUTEST_HAS_RTTI
    const char* const name = typeid(T).name();

#if IUTEST_HAS_HDR_CXXABI
    using abi::__cxa_demangle;
    int status=1;
    char* const read_name = __cxa_demangle(name, 0, 0, &status);
    ::std::string str(status == 0 ? read_name : name);
#if defined(_IUTEST_DEBUG)
    if( status != 0 ) {
        fprintf(stderr, "Unable to demangle \"%s\" -> \"%s\". (status=%d)\n", name, read_name ? read_name : "", status);
        fflush(stderr);
    }
#endif
    free(read_name);
    return str;
#else
    return name;
#endif

#else
    return "<type>";
#endif
}